

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_ialltoallw_(void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Fint *sendtypes,
                       void *recvbuf,int *recvcounts,int *rdispls,MPIABI_Fint *recvtypes,
                       MPIABI_Fint *comm,MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  mpi_ialltoallw_();
  return;
}

Assistant:

void mpiabi_ialltoallw_(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  const MPIABI_Fint * sendtypes,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  const MPIABI_Fint * recvtypes,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ialltoallw_(
    sendbuf,
    sendcounts,
    sdispls,
    sendtypes,
    recvbuf,
    recvcounts,
    rdispls,
    recvtypes,
    comm,
    request,
    ierror
  );
}